

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O1

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
tchecker::syncprod::system_t::labels
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *this,string *labels)

{
  size_type num_bits;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  invalid_argument *piVar4;
  long *plVar5;
  pointer ppVar6;
  undefined8 name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  undefined1 local_a8 [24];
  long lStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  anon_union_16_2_ba345be5_for_m_Storage local_68;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  num_bits = *(stored_size_type *)
              ((long)&(this->super_labels_t)._labels_index._key_map.m_flat_tree.m_data.m_seq.
                      m_holder + 8);
  if (num_bits !=
      *(stored_size_type *)
       ((long)&(this->super_labels_t)._labels_index._value_map.m_flat_tree.m_data.m_seq.m_holder + 8
       )) {
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x90,
                  "size_t tchecker::index_t<std::basic_string<char>, unsigned int>::size() const [KEY = std::basic_string<char>, T = unsigned int]"
                 );
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,num_bits,0,(allocator<unsigned_long> *)local_a8);
  iVar3 = std::__cxx11::string::compare((char *)labels);
  if (iVar3 != 0) {
    local_88._M_allocated_capacity = 0;
    local_88._8_8_ = (string *)0x0;
    local_78 = 0;
    local_a8._0_8_ = ",";
    local_a8._8_8_ = "";
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_68,(iterator_range<const_char_*> *)local_a8);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,labels,(is_any_ofF<char> *)&local_68,token_compress_off);
    if ((0x10 < local_58) && (local_68.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_68.m_dynSet);
    }
    uVar1 = local_88._8_8_;
    if (local_88._M_allocated_capacity != local_88._8_8_) {
      name = local_88._M_allocated_capacity;
      do {
        bVar2 = labels_t::is_label(&this->super_labels_t,(string *)name);
        if (!bVar2) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,"Unknown label \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_a8._0_8_ = *plVar5;
          ppVar6 = (pointer)(plVar5 + 2);
          if ((pointer)local_a8._0_8_ == ppVar6) {
            local_a8._16_8_ = (ppVar6->first)._M_dataplus._M_p;
            lStack_90 = plVar5[3];
            local_a8._0_8_ = (pointer)(local_a8 + 0x10);
          }
          else {
            local_a8._16_8_ = (ppVar6->first)._M_dataplus._M_p;
          }
          local_a8._8_8_ = plVar5[1];
          *plVar5 = (long)ppVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar4,(string *)local_a8);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)local_a8,(key_type *)&this->super_labels_t);
        if ((pointer)local_a8._0_8_ ==
            (pointer)(*(stored_size_type *)
                       ((long)&(this->super_labels_t)._labels_index._key_map.m_flat_tree.m_data.
                               m_seq.m_holder + 8) * 0x28 +
                     (long)(this->super_labels_t)._labels_index._key_map.m_flat_tree.m_data.m_seq.
                           m_holder.m_start)) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar4,"key is not indexed");
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (__return_storage_ptr__,(ulong)*(uint *)(local_a8._0_8_ + 0x20),true);
        name = name + 0x20;
      } while (name != uVar1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> system_t::labels(std::string const & labels) const
{
  boost::dynamic_bitset<> s{this->labels_count()};
  if (labels == "")
    return s;

  std::vector<std::string> v;
  boost::split(v, labels, boost::is_any_of(","));
  for (std::string const & l : v) {
    if (!this->is_label(l))
      throw std::invalid_argument("Unknown label '" + l + "'");
    s.set(this->label_id(l));
  }
  return s;
}